

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::SolveStrategy::doNotify(SolveStrategy *this,Event event)

{
  __int_type _Var1;
  
  switch(event) {
  case event_attach:
    _Var1 = 1;
    break;
  case event_model:
    _Var1 = 2;
    break;
  case event_resume:
    LOCK();
    if ((this->state_).super___atomic_base<unsigned_int>._M_i == 2) {
      (this->state_).super___atomic_base<unsigned_int>._M_i = 1;
    }
    UNLOCK();
    return;
  case event_detach:
    _Var1 = 4;
    break;
  default:
    goto switchD_0011c951_default;
  }
  LOCK();
  (this->state_).super___atomic_base<unsigned_int>._M_i = _Var1;
  UNLOCK();
switchD_0011c951_default:
  return;
}

Assistant:

virtual void doNotify(Event event) {
		switch (event) {
			case event_attach: state_ = state_run;   break;
			case event_model : state_ = state_model; break;
			case event_resume: compare_and_swap(state_, uint32(state_model), uint32(state_run)); break;
			case event_detach: state_ = state_done; break;
		};
	}